

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pshufw_mmx_x86_64(MMXReg *d,MMXReg *s,int order)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  
  uVar1 = *(uint16_t *)((long)s + (ulong)((uint)order >> 1 & 6));
  uVar2 = *(uint16_t *)((long)s + (ulong)((uint)order >> 3 & 6));
  uVar3 = *(uint16_t *)((long)s + (ulong)((uint)order >> 5 & 6));
  d->_w_MMXReg[0] = s->_w_MMXReg[order & 3];
  d->_w_MMXReg[1] = uVar1;
  d->_w_MMXReg[2] = uVar2;
  d->_w_MMXReg[3] = uVar3;
  return;
}

Assistant:

void glue(helper_pshufw, SUFFIX)(Reg *d, Reg *s, int order)
{
    Reg r;

    r.W(0) = s->W(order & 3);
    r.W(1) = s->W((order >> 2) & 3);
    r.W(2) = s->W((order >> 4) & 3);
    r.W(3) = s->W((order >> 6) & 3);
    *d = r;
}